

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O2

void __thiscall Js::Profiler::Profiler(Profiler *this,ArenaAllocator *allocator)

{
  long lVar1;
  
  FixedStack<Js::TimeEntry,_20>::FixedStack(&this->timeStack);
  TreeNode<Js::UnitData,_373>::TreeNode(&this->rootNode,(TreeNode<Js::UnitData,_373> *)0x0);
  this->alloc = allocator;
  this->curNode = &this->rootNode;
  for (lVar1 = 0x29; lVar1 != 0x19e; lVar1 = lVar1 + 1) {
    *(undefined8 *)(&(this->timeStack).itemList[0].tag + lVar1 * 4) = 0;
  }
  return;
}

Assistant:

Profiler::Profiler(ArenaAllocator * allocator) :
        alloc(allocator),
        rootNode(NULL)
    {
        this->curNode = &this->rootNode;

        for(int i = 0; i < PhaseCount; i++)
        {
            this->inclSumAtLevel[i] = 0;
        }
    }